

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlSInteger.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlSInteger::ReadData(EbmlSInteger *this,IOCallback *input,ScopeMode ReadFully)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint local_28;
  byte local_24 [4];
  uint i;
  binary Buffer [8];
  ScopeMode ReadFully_local;
  IOCallback *input_local;
  EbmlSInteger *this_local;
  
  Buffer._0_4_ = ReadFully;
  unique0x1000011f = input;
  if (ReadFully != SCOPE_NO_DATA) {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    IOCallback::readFully(input,local_24,CONCAT44(extraout_var,iVar1));
    if ((local_24[0] & 0x80) == 0) {
      this->Value = 0;
    }
    else {
      this->Value = -1;
    }
    local_28 = 0;
    while( true ) {
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
      if (CONCAT44(extraout_var_00,iVar1) <= (ulong)local_28) break;
      this->Value = this->Value << 8;
      this->Value = (ulong)local_24[local_28] | this->Value;
      local_28 = local_28 + 1;
    }
    EbmlElement::SetValueIsSet(&this->super_EbmlElement,true);
  }
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
  return CONCAT44(extraout_var_01,iVar1);
}

Assistant:

filepos_t EbmlSInteger::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  if (ReadFully != SCOPE_NO_DATA) {
    binary Buffer[8];
    input.readFully(Buffer, GetSize());

    if (Buffer[0] & 0x80)
      Value = -1; // this is a negative value
    else
      Value = 0; // this is a positive value

    for (unsigned int i=0; i<GetSize(); i++) {
      Value <<= 8;
      Value |= Buffer[i];
    }
    SetValueIsSet();
  }

  return GetSize();
}